

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
pstore::json::details::number_matcher<callbacks_proxy<mock_json_callbacks>_>::in_terminal_state
          (number_matcher<callbacks_proxy<mock_json_callbacks>_> *this)

{
  int iVar1;
  number_matcher<callbacks_proxy<mock_json_callbacks>_> *this_local;
  
  iVar1 = matcher<callbacks_proxy<mock_json_callbacks>_>::get_state
                    (&this->super_matcher<callbacks_proxy<mock_json_callbacks>_>);
  if ((((iVar1 == 1) || (iVar1 - 4U < 2)) || (iVar1 == 7)) || (iVar1 == 10)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool number_matcher<Callbacks>::in_terminal_state () const {
                switch (this->get_state ()) {
                case integer_digit_state:
                case frac_state:
                case frac_digit_state:
                case exponent_digit_state:
                case done_state: return true;
                default: return false;
                }
            }